

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

FlagBase * __thiscall
args::NargsValueFlag<int,_args::detail::vector,_args::ValueReader>::Match
          (NargsValueFlag<int,_args::detail::vector,_args::ValueReader> *this,EitherFlag *arg)

{
  pointer piVar1;
  int iVar2;
  FlagBase *pFVar3;
  
  iVar2 = (*(this->super_FlagBase).super_NamedBase.super_Base._vptr_Base[2])();
  pFVar3 = FlagBase::Match(&this->super_FlagBase,arg);
  if ((pFVar3 != (FlagBase *)0x0 && (char)iVar2 == '\0') &&
     (piVar1 = (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish != piVar1)) {
    (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  return pFVar3;
}

Assistant:

virtual FlagBase *Match(const EitherFlag &arg) override
            {
                const bool wasMatched = Matched();
                auto me = FlagBase::Match(arg);
                if (me && !wasMatched)
                {
                    values.clear();
                }
                return me;
            }